

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O1

void Assimp::FBX::anon_unknown_20::ReadBinaryDataArrayHead
               (char **data,char *end,char *type,uint32_t *count,Element *el)

{
  string local_38;
  
  if (4 < (ulong)((long)end - (long)*data)) {
    *type = **data;
    *count = *(uint32_t *)(*data + 1);
    *data = *data + 5;
    return;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "binary data array is too short, need five (5) bytes for type signature and element count"
             ,"");
  anon_unknown.dwarf_12b4b87::ParseError(&local_38,el);
}

Assistant:

void ReadBinaryDataArrayHead(const char*& data, const char* end, char& type, uint32_t& count,
    const Element& el)
{
    if (static_cast<size_t>(end-data) < 5) {
        ParseError("binary data array is too short, need five (5) bytes for type signature and element count",&el);
    }

    // data type
    type = *data;

    // read number of elements
    BE_NCONST uint32_t len = SafeParse<uint32_t>(data+1, end);
    AI_SWAP4(len);

    count = len;
    data += 5;
}